

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<int,_QDBusPlatformMenuItem_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QDBusPlatformMenuItem_*>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_QDBusPlatformMenuItem_*>_> *this,int *key)

{
  byte bVar1;
  Node<int,_QDBusPlatformMenuItem_*> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<int>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<int,_QDBusPlatformMenuItem_*> *)0x0;
  }
  else {
    pNVar2 = (Node<int,_QDBusPlatformMenuItem_*> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }